

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  l_uint32 *plVar1;
  int iVar2;
  BinOpr BVar3;
  anon_union_8_6_45a55102_for_u aVar4;
  BinOpr op;
  UnOpr opr;
  expdesc v2;
  
  luaE_incCstack(ls->L);
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x106:
    v->t = -1;
    v->f = -1;
    v->k = VFALSE;
    goto LAB_0012c49b;
  case 0x107:
  case 0x109:
  case 0x10a:
  case 0x10b:
  case 0x10c:
switchD_0012c39b_caseD_107:
    suffixedexp(ls,v);
    break;
  case 0x108:
    luaX_next(ls);
    body(ls,v,0,ls->linenumber);
    break;
  case 0x10d:
    v->t = -1;
    v->f = -1;
    v->k = VNIL;
LAB_0012c49b:
    (v->u).info = 0;
LAB_0012c4f0:
    luaX_next(ls);
    break;
  case 0x10e:
    opr = OPR_NOT;
LAB_0012c4a5:
    iVar2 = ls->linenumber;
    luaX_next(ls);
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,opr,v,iVar2);
    break;
  default:
    if (iVar2 == 0x23) {
      opr = OPR_LEN;
      goto LAB_0012c4a5;
    }
    if (iVar2 == 0x124) {
      aVar4 = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
      v->t = -1;
      v->f = -1;
      v->k = VKSTR;
LAB_0012c4ec:
      v->u = aVar4;
      goto LAB_0012c4f0;
    }
    if (iVar2 == 0x7b) {
      constructor(ls,v);
      break;
    }
    if (iVar2 == 0x7e) {
      opr = OPR_BNOT;
      goto LAB_0012c4a5;
    }
    if (iVar2 == 0x113) {
      v->t = -1;
      v->f = -1;
      v->k = VTRUE;
      goto LAB_0012c49b;
    }
    if (iVar2 == 0x118) {
      if (ls->fs->f->is_vararg == '\0') {
        luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
      }
      iVar2 = luaK_codeABCk(ls->fs,OP_VARARG,0,0,1,0);
      v->t = -1;
      v->f = -1;
      v->k = VVARARG;
      (v->u).info = iVar2;
    }
    else {
      if (iVar2 != 0x121) {
        if (iVar2 == 0x122) {
          v->t = -1;
          v->f = -1;
          v->k = VKINT;
          (v->u).info = 0;
          aVar4 = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
          goto LAB_0012c4ec;
        }
        if (iVar2 != 0x2d) goto switchD_0012c39b_caseD_107;
        opr = OPR_MINUS;
        goto LAB_0012c4a5;
      }
      v->t = -1;
      v->f = -1;
      v->k = VKFLT;
      (v->u).info = 0;
      v->u = *(anon_union_8_6_45a55102_for_u *)&(ls->t).seminfo;
    }
    goto LAB_0012c4f0;
  }
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x10f:
    op = OPR_OR;
    break;
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x118:
    goto switchD_0012c561_caseD_27;
  case 0x116:
    op = OPR_IDIV;
    break;
  case 0x117:
    op = OPR_CONCAT;
    break;
  case 0x119:
    op = OPR_EQ;
    break;
  case 0x11a:
    op = OPR_GE;
    break;
  case 0x11b:
    op = OPR_LE;
    break;
  case 0x11c:
    op = OPR_NE;
    break;
  case 0x11d:
    op = OPR_SHL;
    break;
  case 0x11e:
    op = OPR_SHR;
    break;
  default:
    switch(iVar2) {
    case 0x25:
      op = OPR_MOD;
      break;
    case 0x26:
      op = OPR_BAND;
      break;
    case 0x2a:
      op = OPR_MUL;
      break;
    case 0x2b:
      op = OPR_ADD;
      break;
    case 0x2d:
      op = OPR_SUB;
      break;
    case 0x2f:
      op = OPR_DIV;
      break;
    default:
      if (iVar2 == 0x3c) {
        op = OPR_LT;
        break;
      }
      if (iVar2 == 0x3e) {
        op = OPR_GT;
        break;
      }
      if (iVar2 == 0x5e) {
        op = OPR_POW;
        break;
      }
      if (iVar2 == 0x7c) {
        op = OPR_BOR;
        break;
      }
      if (iVar2 == 0x7e) {
        op = OPR_BXOR;
        break;
      }
      if (iVar2 == 0x100) {
        op = OPR_AND;
        break;
      }
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_0012c561_caseD_27:
      op = OPR_NOBINOPR;
    }
  }
  while ((op != OPR_NOBINOPR && (limit < (int)(uint)priority[op].left))) {
    iVar2 = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs,op,v);
    BVar3 = subexpr(ls,&v2,(uint)priority[op].right);
    luaK_posfix(ls->fs,op,v,&v2,iVar2);
    op = BVar3;
  }
  plVar1 = &ls->L->nCcalls;
  *plVar1 = *plVar1 - 1;
  return op;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {  /* prefix (unary) operator? */
    int line = ls->linenumber;
    luaX_next(ls);  /* skip operator */
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line);
  }
  else simpleexp(ls, v);
  /* expand while operators have priorities higher than 'limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2;
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);  /* skip operator */
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    luaK_posfix(ls->fs, op, v, &v2, line);
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}